

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
* __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,false>>>
::
_reduce_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,false>>>
          *this,ID_index cellID,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *boundary,Dimension dim)

{
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  Index currentIndex;
  Index IVar1;
  undefined4 uVar2;
  pointer ppVar3;
  pointer ppVar4;
  long lVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  mapped_type *__args;
  _List_node_base *p_Var8;
  mapped_type currentIndex_00;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,false>>>
  *pCVar9;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  chainsInH;
  Tmp_column column;
  _List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> local_90;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_88;
  Dimension local_80;
  ID_index local_7c;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_78;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  local_7c = cellID;
  std::
  map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::
  map<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>const*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
            ((map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)&local_60,
             (boundary->
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (boundary->
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  if (dim == -1) {
    ppVar3 = (boundary->
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = (boundary->
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    dim = 0;
    if (ppVar3 != ppVar4) {
      dim = (int)((ulong)((long)ppVar3 - (long)ppVar4) >> 3) + -1;
    }
  }
  local_78.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((boundary->
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (boundary->
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_90._M_node._0_4_ = 1;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
    ::_M_emplace_unique<unsigned_int&,int>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                *)&local_60,&local_7c,(int *)&local_90);
    _container_insert<std::map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
              (this,(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)&local_60,*(Index *)(this + 0xd0),dim);
    p_Var8 = (_List_node_base *)operator_new(0x20);
    pCVar9 = this + 0x50;
    uVar2 = *(undefined4 *)(this + 0x50);
    *(Dimension *)&p_Var8[1]._M_next = dim;
    *(undefined4 *)((long)&p_Var8[1]._M_next + 4) = uVar2;
    *(undefined4 *)&p_Var8[1]._M_prev = 0xffffffff;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    local_90._M_node = *(_List_node_base **)(this + 8);
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
              ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(this + 0x18),(const_iterator)0x0,(uint *)pCVar9,&local_90);
    *(uint *)pCVar9 = *(uint *)pCVar9 + 1;
  }
  else {
    local_88 = __return_storage_ptr__;
    local_80 = dim;
    lVar5 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    local_90._M_node._0_4_ = *(undefined4 *)(lVar5 + 0x20);
    this_01 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)(this + 0x98);
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at(this_01,(key_type *)&local_90);
    currentIndex_00 = *pmVar6;
    this_00 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)(this + 0x60);
    while( true ) {
      local_90._M_node._0_4_ = currentIndex_00;
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at(this_00,(key_type *)&local_90);
      if ((pmVar7->super_Chain_column_option).pairedColumn_ == 0xffffffff) break;
      Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
      ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
                      *)this,(Tmp_column *)&local_60,&local_78,currentIndex_00);
      if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
        ::_build_from_H((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
                         *)this,local_7c,(Tmp_column *)&local_60,&local_78);
        _container_insert<std::map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                  (this,(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)&local_60,*(Index *)(this + 0xd0),local_80);
        p_Var8 = (_List_node_base *)operator_new(0x20);
        pCVar9 = this + 0x50;
        uVar2 = *(undefined4 *)(this + 0x50);
        *(Dimension *)&p_Var8[1]._M_next = local_80;
        *(undefined4 *)((long)&p_Var8[1]._M_next + 4) = uVar2;
        *(undefined4 *)&p_Var8[1]._M_prev = 0xffffffff;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
        local_90._M_node = *(_List_node_base **)(this + 8);
        std::__detail::
        _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
                  ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)(this + 0x18),(const_iterator)0x0,(uint *)pCVar9,&local_90);
        *(uint *)pCVar9 = *(uint *)pCVar9 + 1;
        __return_storage_ptr__ = local_88;
        goto LAB_00135f75;
      }
      lVar5 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
      local_90._M_node._0_4_ = *(undefined4 *)(lVar5 + 0x20);
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at(this_01,(key_type *)&local_90);
      currentIndex_00 = *pmVar6;
    }
    if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
      do {
        lVar5 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
        local_90._M_node._0_4_ = *(undefined4 *)(lVar5 + 0x20);
        pmVar6 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at(this_01,(key_type *)&local_90);
        currentIndex = *pmVar6;
        local_90._M_node._0_4_ = currentIndex;
        pmVar7 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at(this_00,(key_type *)&local_90);
        if ((pmVar7->super_Chain_column_option).pairedColumn_ == 0xffffffff) {
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
          ::_reduce_by_F((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
                          *)this,(Tmp_column *)&local_60,local_88,currentIndex);
        }
        else {
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
          ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
                          *)this,(Tmp_column *)&local_60,&local_78,currentIndex);
        }
      } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 0);
    }
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
    ::_update_largest_death_in_F
              ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
                *)this,local_88);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
    ::_build_from_H((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
                     *)this,local_7c,(Tmp_column *)&local_60,&local_78);
    IVar1 = ((local_88->
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->first;
    _container_insert<std::map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
              (this,(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)&local_60,*(Index *)(this + 0xd0),local_80);
    local_90._M_node._0_4_ = *(Index *)(this + 0xd0);
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at(this_00,(key_type *)&local_90);
    (pmVar7->super_Chain_column_option).pairedColumn_ = IVar1;
    local_90._M_node._0_4_ = IVar1;
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at(this_00,(key_type *)&local_90);
    (pmVar7->super_Chain_column_option).pairedColumn_ = *(Index *)(this + 0xd0);
    local_90._M_node._0_4_ = IVar1;
    __args = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)(this + 0x18),(key_type *)&local_90);
    pCVar9 = this + 0x50;
    *(undefined4 *)&__args->_M_node[1]._M_prev = *(undefined4 *)(this + 0x50);
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
              ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(this + 0x18),(const_iterator)0x0,(uint *)pCVar9,__args);
    *(int *)pCVar9 = *(int *)pCVar9 + 1;
    __return_storage_ptr__ = local_88;
  }
LAB_00135f75:
  *(int *)(this + 0xd0) = *(int *)(this + 0xd0) + 1;
  if (local_78.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}